

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void duckdb_parquet::swap(FileCryptoMetaData *a,FileCryptoMetaData *b)

{
  _FileCryptoMetaData__isset _Var1;
  
  swap(&a->encryption_algorithm,&b->encryption_algorithm);
  std::__cxx11::string::swap((string *)&a->key_metadata);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(FileCryptoMetaData &a, FileCryptoMetaData &b) {
  using ::std::swap;
  swap(a.encryption_algorithm, b.encryption_algorithm);
  swap(a.key_metadata, b.key_metadata);
  swap(a.__isset, b.__isset);
}